

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

enable_if_t<std::is_same<PathData,_PathData>::value,_void> __thiscall
rlottie::internal::model::Property<rlottie::internal::model::PathData,_void>::
value<rlottie::internal::model::PathData>
          (Property<rlottie::internal::model::PathData,_void> *this,int frameNo,VPath *path)

{
  Frame *pFVar1;
  const_iterator __begin0;
  Frame *this_00;
  float t;
  float fVar2;
  
  if (this->isValue_ == false) {
    fVar2 = (float)frameNo;
    this_00 = (Frame *)**(long **)&this->impl_;
    if (fVar2 <= this_00->start_) {
      this = (Property<rlottie::internal::model::PathData,_void> *)&this_00->value_;
    }
    else {
      pFVar1 = (Frame *)(*(long **)&this->impl_)[1];
      if (fVar2 < pFVar1[-1].end_) {
        for (; this_00 != pFVar1; this_00 = this_00 + 1) {
          if ((this_00->start_ <= fVar2) && (fVar2 < this_00->end_)) {
            t = KeyFrames<rlottie::internal::model::PathData,_void>::Frame::progress
                          (this_00,frameNo);
            PathData::lerp(&(this_00->value_).start_,&(this_00->value_).end_,t,path);
          }
        }
        return;
      }
      this = (Property<rlottie::internal::model::PathData,_void> *)&pFVar1[-1].value_.end_;
    }
  }
  PathData::toPath((PathData *)this,path);
  return;
}

Assistant:

auto value(int frameNo, VPath &path) const ->
        typename std::enable_if_t<std::is_same<T, forT>::value, void>
    {
        if (isStatic()) {
            value().toPath(path);
        } else {
            const auto &vec = animation().frames_;
            if (vec.front().start_ >= frameNo)
                return vec.front().value_.start_.toPath(path);
            if (vec.back().end_ <= frameNo)
                return vec.back().value_.end_.toPath(path);

            for (const auto &keyFrame : vec) {
                if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_) {
                    T::lerp(keyFrame.value_.start_, keyFrame.value_.end_,
                            keyFrame.progress(frameNo), path);
                }
            }
        }
    }